

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_17::NameGenerator::BeginIfExpr(NameGenerator *this,IfExpr *expr)

{
  Index index;
  IfExpr *expr_local;
  NameGenerator *this_local;
  
  index = this->label_count_;
  this->label_count_ = index + 1;
  MaybeGenerateName("$I",index,&(expr->true_).label);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameGenerator::BeginIfExpr(IfExpr* expr) {
  MaybeGenerateName("$I", label_count_++, &expr->true_.label);
  return Result::Ok;
}